

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void xmlFreeParserInputBuffer(xmlParserInputBufferPtr in)

{
  xmlParserInputBufferPtr in_local;
  
  if (in != (xmlParserInputBufferPtr)0x0) {
    if (in->raw != (xmlBufPtr)0x0) {
      xmlBufFree(in->raw);
      in->raw = (xmlBufPtr)0x0;
    }
    if (in->encoder != (xmlCharEncodingHandlerPtr)0x0) {
      xmlCharEncCloseFunc(in->encoder);
    }
    if (in->closecallback != (xmlInputCloseCallback)0x0) {
      (*in->closecallback)(in->context);
    }
    if (in->buffer != (xmlBufPtr)0x0) {
      xmlBufFree(in->buffer);
      in->buffer = (xmlBufPtr)0x0;
    }
    (*xmlFree)(in);
  }
  return;
}

Assistant:

void
xmlFreeParserInputBuffer(xmlParserInputBufferPtr in) {
    if (in == NULL) return;

    if (in->raw) {
        xmlBufFree(in->raw);
	in->raw = NULL;
    }
    if (in->encoder != NULL) {
        xmlCharEncCloseFunc(in->encoder);
    }
    if (in->closecallback != NULL) {
	in->closecallback(in->context);
    }
    if (in->buffer != NULL) {
        xmlBufFree(in->buffer);
	in->buffer = NULL;
    }

    xmlFree(in);
}